

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_widget_has_mouse_click_down(nk_context *ctx,nk_buttons btn,nk_bool down)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  nk_rect b;
  long in_RDI;
  float fVar4;
  float fVar5;
  float fVar6;
  nk_rect bounds;
  nk_rect v;
  nk_rect c;
  float local_48;
  float fStackY_44;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  nk_context *in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  float fStack_1c;
  nk_bool local_4;
  
  if (((in_RDI == 0) || (*(long *)(in_RDI + 0x40d8) == 0)) ||
     (*(long *)(in_RDI + 0x40d0) != *(long *)(in_RDI + 0x40d8))) {
    local_4 = 0;
  }
  else {
    lVar1 = *(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8);
    uVar2 = *(undefined8 *)(lVar1 + 0x44);
    uVar3 = *(undefined8 *)(lVar1 + 0x4c);
    fStack_1c = (float)((ulong)uVar3 >> 0x20);
    fVar4 = (float)(int)(float)uVar2;
    fVar5 = (float)(int)(float)((ulong)uVar2 >> 0x20);
    fVar6 = (float)(int)(float)uVar3;
    nk_layout_peek((nk_rect *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
    nk_unify((nk_rect *)&stack0xffffffffffffffc8,(nk_rect *)&stack0xffffffffffffffd8,local_48,
             fStackY_44,local_48 + in_stack_ffffffffffffffc0,fStackY_44 + in_stack_ffffffffffffffc4)
    ;
    if (((fVar4 + fVar6 <= local_48) || (local_48 + in_stack_ffffffffffffffc0 <= fVar4)) ||
       ((fVar5 + (float)(int)fStack_1c <= fStackY_44 ||
        (fStackY_44 + in_stack_ffffffffffffffc4 <= fVar5)))) {
      local_4 = 0;
    }
    else {
      b.y = fVar4;
      b.x = in_stack_ffffffffffffffd4;
      b.w = fVar5;
      b.h = fVar6;
      local_4 = nk_input_has_mouse_click_down_in_rect
                          (&in_stack_ffffffffffffffc8->input,(nk_buttons)in_stack_ffffffffffffffc4,b
                           ,(nk_bool)in_stack_ffffffffffffffc0);
    }
  }
  return local_4;
}

Assistant:

NK_API nk_bool
nk_widget_has_mouse_click_down(struct nk_context *ctx, enum nk_buttons btn, nk_bool down)
{
struct nk_rect c, v;
struct nk_rect bounds;
NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
if (!ctx || !ctx->current || ctx->active != ctx->current)
return 0;

c = ctx->current->layout->clip;
c.x = (float)((int)c.x);
c.y = (float)((int)c.y);
c.w = (float)((int)c.w);
c.h = (float)((int)c.h);

nk_layout_peek(&bounds, ctx);
nk_unify(&v, &c, bounds.x, bounds.y, bounds.x + bounds.w, bounds.y + bounds.h);
if (!NK_INTERSECT(c.x, c.y, c.w, c.h, bounds.x, bounds.y, bounds.w, bounds.h))
return 0;
return nk_input_has_mouse_click_down_in_rect(&ctx->input, btn, bounds, down);
}